

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampbuf.c
# Opt level: O0

sample_t_conflict ** create_sample_buffer(int n_channels,int32 length)

{
  sample_t_conflict *psVar1;
  int in_ESI;
  int in_EDI;
  sample_t_conflict **samples;
  int i;
  int local_14;
  sample_t_conflict **local_8;
  
  local_8 = (sample_t_conflict **)malloc((long)in_EDI << 3);
  if (local_8 == (sample_t_conflict **)0x0) {
    local_8 = (sample_t_conflict **)0x0;
  }
  else {
    psVar1 = (sample_t_conflict *)malloc((long)(in_EDI * in_ESI) << 2);
    *local_8 = psVar1;
    if (*local_8 == (sample_t_conflict *)0x0) {
      free(local_8);
      local_8 = (sample_t_conflict **)0x0;
    }
    else {
      for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
        local_8[local_14] = local_8[local_14 + -1] + in_ESI;
      }
    }
  }
  return local_8;
}

Assistant:

sample_t **create_sample_buffer(int n_channels, int32 length)
{
	int i;
	sample_t **samples = malloc(n_channels * sizeof(*samples));
	if (!samples) return NULL;
	samples[0] = malloc(n_channels * length * sizeof(*samples[0]));
	if (!samples[0]) {
		free(samples);
		return NULL;
	}
	for (i = 1; i < n_channels; i++) samples[i] = samples[i-1] + length;
	return samples;
}